

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

void * __thiscall rcg::Buffer::getBase(Buffer *this,uint32_t part)

{
  bool bVar1;
  element_type *peVar2;
  BUFFER_HANDLE pvVar3;
  GC_ERROR GVar4;
  void *pvVar5;
  void *pvVar6;
  void *ret;
  size_t size;
  INFO_DATATYPE type;
  void *local_30;
  size_t local_28;
  INFO_DATATYPE local_1c;
  
  bVar1 = this->multipart;
  pvVar5 = Stream::getHandle(this->parent);
  peVar2 = (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pvVar3 = this->buffer;
  if (bVar1 == true) {
    local_30 = (void *)0x0;
    local_28 = 8;
    if (pvVar3 == (BUFFER_HANDLE)0x0 || pvVar5 == (void *)0x0) {
      local_30 = (void *)0x0;
    }
    else {
      (*peVar2->DSGetBufferPartInfo)(pvVar5,pvVar3,part,0,&local_1c,&local_30,&local_28);
    }
  }
  else {
    local_30 = (void *)0x0;
    local_28 = 8;
    pvVar6 = (void *)0x0;
    if ((pvVar3 != (BUFFER_HANDLE)0x0 && pvVar5 != (void *)0x0) &&
       (GVar4 = (*peVar2->DSGetBufferInfo)(pvVar5,pvVar3,0,&local_1c,&local_30,&local_28),
       GVar4 == 0)) {
      pvVar6 = local_30;
    }
    pvVar5 = Stream::getHandle(this->parent);
    local_30 = (void *)0x0;
    local_28 = 8;
    if ((this->buffer == (BUFFER_HANDLE)0x0 || pvVar5 == (void *)0x0) ||
       (GVar4 = (*((this->gentl).
                   super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  DSGetBufferInfo)(pvVar5,this->buffer,0x12,&local_1c,&local_30,&local_28),
       GVar4 != 0)) {
      local_30 = (void *)0x0;
    }
    local_30 = (void *)((long)pvVar6 + (long)local_30);
  }
  return local_30;
}

Assistant:

void *Buffer::getBase(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<void *>(gentl, parent->getHandle(), buffer, part,
                                      GenTL::BUFFER_PART_INFO_BASE);
  }
  else
  {
    void *ret=getBufferValue<void *>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_BASE);

    size_t offset=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                         GenTL::BUFFER_INFO_IMAGEOFFSET);

    if (offset > 0)
    {
      ret=reinterpret_cast<char *>(ret)+offset;
    }

    return ret;
  }
}